

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O3

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _w;
  uint _h;
  uint _c;
  ulong uVar2;
  float *pfVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  
  iVar1 = bottom_blob->dims;
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  iVar4 = 0;
  if (iVar1 == 3) {
    _c = bottom_blob->c;
    Mat::create(top_blob,_w,_h,_c,1,opt->blob_allocator);
    iVar4 = -100;
    if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
       (iVar4 = 0, 0 < (int)_c)) {
      uVar6 = 0;
      do {
        uVar2 = 0;
        if (this->scale_in_data_size != 1) {
          uVar2 = uVar6 & 0xffffffff;
        }
        if (this->bias_data_size == 0) {
          fVar7 = 0.0;
        }
        else {
          if (this->bias_data_size == 1) {
            pfVar3 = (float *)(this->bias_data).data;
          }
          else {
            pfVar3 = (float *)(uVar6 * 4 + (long)(this->bias_data).data);
          }
          fVar7 = *pfVar3;
        }
        iVar4 = 0;
        uVar5 = 0;
        if (this->scale_out_data_size != 1) {
          uVar5 = uVar6 & 0xffffffff;
        }
        requantize((int *)(bottom_blob->cstep * uVar6 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                   (char *)(top_blob->cstep * uVar6 * top_blob->elemsize + (long)top_blob->data),
                   *(float *)((long)(this->scale_in_data).data + uVar2 * 4),fVar7,
                   *(float *)((long)(this->scale_out_data).data + uVar5 * 4),this->activation_type,
                   &this->activation_params,_h * _w);
        uVar6 = uVar6 + 1;
      } while (uVar6 != _c);
    }
  }
  else if (iVar1 == 2) {
    Mat::create(top_blob,_w,_h,1,opt->blob_allocator);
    iVar4 = -100;
    if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
       (iVar4 = 0, 0 < (int)_h)) {
      uVar6 = 0;
      do {
        uVar2 = 0;
        if (this->scale_in_data_size != 1) {
          uVar2 = uVar6 & 0xffffffff;
        }
        if (this->bias_data_size == 0) {
          fVar7 = 0.0;
        }
        else {
          if (this->bias_data_size == 1) {
            pfVar3 = (float *)(this->bias_data).data;
          }
          else {
            pfVar3 = (float *)(uVar6 * 4 + (long)(this->bias_data).data);
          }
          fVar7 = *pfVar3;
        }
        iVar4 = 0;
        uVar5 = 0;
        if (this->scale_out_data_size != 1) {
          uVar5 = uVar6 & 0xffffffff;
        }
        requantize((int *)((long)bottom_blob->w * uVar6 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                   (char *)((long)top_blob->w * uVar6 * top_blob->elemsize + (long)top_blob->data),
                   *(float *)((long)(this->scale_in_data).data + uVar2 * 4),fVar7,
                   *(float *)((long)(this->scale_out_data).data + uVar5 * 4),this->activation_type,
                   &this->activation_params,_w);
        uVar6 = uVar6 + 1;
      } while (uVar6 != _h);
    }
  }
  else if (iVar1 == 1) {
    Mat::create(top_blob,_w,1,opt->blob_allocator);
    iVar4 = -100;
    if (((char *)top_blob->data != (char *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (this->bias_data_size == 0) {
        fVar7 = 0.0;
      }
      else {
        fVar7 = *(this->bias_data).data;
      }
      requantize((int *)bottom_blob->data,(char *)top_blob->data,*(this->scale_in_data).data,fVar7,
                 *(this->scale_out_data).data,this->activation_type,&this->activation_params,_w);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_in_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1
        // assert scale_out_data_size == 1

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        const float scale_in = scale_in_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];
        const float scale_out = scale_out_data[0];

        requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w * h);
        }
    }

    return 0;
}